

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intDup.c
# Opt level: O0

Aig_Man_t * Inter_ManStartDuplicated(Aig_Man_t *p)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  int iVar2;
  Aig_Man_t *p_01;
  char *pcVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  void *pvVar6;
  Aig_Obj_t *p1;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManRegNum(p);
  if (iVar1 < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/int/intDup.c"
                  ,0x4e,"Aig_Man_t *Inter_ManStartDuplicated(Aig_Man_t *)");
  }
  iVar1 = Aig_ManObjNumMax(p);
  p_01 = Aig_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_01->pSpec = pcVar3;
  Aig_ManCleanData(p);
  pAVar4 = Aig_ManConst1(p_01);
  pAVar5 = Aig_ManConst1(p);
  (pAVar5->field_5).pData = pAVar4;
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vCis), local_24 < iVar1; local_24 = local_24 + 1) {
    pvVar6 = Vec_PtrEntry(p->vCis,local_24);
    pAVar4 = Aig_ObjCreateCi(p_01);
    *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar4;
  }
  p_01->nTruePis = p->nTruePis;
  iVar1 = Saig_ManConstrNum(p);
  p_01->nTruePos = iVar1;
  p_01->nRegs = p->nRegs;
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
    if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar4), iVar1 != 0)) {
      pAVar5 = Aig_ObjChild0Copy(pAVar4);
      p1 = Aig_ObjChild1Copy(pAVar4);
      pAVar5 = Aig_And(p_01,pAVar5,p1);
      (pAVar4->field_5).pData = pAVar5;
    }
  }
  for (local_24 = 0; iVar1 = Saig_ManPoNum(p), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_24);
    iVar1 = Saig_ManPoNum(p);
    iVar2 = Saig_ManConstrNum(p);
    if (iVar1 - iVar2 <= local_24) {
      pAVar4 = Aig_ObjChild0Copy(pAVar4);
      pAVar4 = Aig_Not(pAVar4);
      Aig_ObjCreateCo(p_01,pAVar4);
    }
  }
  for (local_24 = 0; iVar1 = Saig_ManRegNum(p), local_24 < iVar1; local_24 = local_24 + 1) {
    p_00 = p->vCos;
    iVar1 = Saig_ManPoNum(p);
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_24 + iVar1);
    pAVar4 = Aig_ObjChild0Copy(pAVar4);
    Aig_ObjCreateCo(p_01,pAVar4);
  }
  Aig_ManCleanup(p_01);
  return p_01;
}

Assistant:

Aig_Man_t * Inter_ManStartDuplicated( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    assert( Aig_ManRegNum(p) > 0 );
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // set registers
    pNew->nTruePis = p->nTruePis;
    pNew->nTruePos = Saig_ManConstrNum(p);
    pNew->nRegs    = p->nRegs;
    // duplicate internal nodes
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );

    // create constraint outputs
    Saig_ManForEachPo( p, pObj, i )
    {
        if ( i < Saig_ManPoNum(p)-Saig_ManConstrNum(p) )
            continue;
        Aig_ObjCreateCo( pNew, Aig_Not( Aig_ObjChild0Copy(pObj) ) );
    }

    // create register inputs with MUXes
    Saig_ManForEachLi( p, pObj, i )
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManCleanup( pNew );
    return pNew;
}